

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>,320ul,16ul>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::parsing::Preprocessor::expandMacro(slang::parsing::Preprocessor::MacroDef,slang::parsing::Preprocessor::MacroExpansion&,slang::syntax::MacroActualArgumentListSyntax*)::ArgTokens>
          (locator *__return_storage_ptr__,void *this,arrays_type *arrays_,size_t pos0,size_t hash,
          try_emplace_args_t *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          ArgTokens *args_2)

{
  char *pcVar1;
  uint uVar2;
  ushort uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar7;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *ppVar8;
  group15<boost::unordered::detail::foa::plain_integral> *pgVar9;
  undefined1 auVar10 [16];
  
  pgVar7 = __return_storage_ptr__->pg;
  uVar5 = (ulong)__return_storage_ptr__->n;
  ppVar8 = __return_storage_ptr__->p;
  lVar6 = 1;
  while( true ) {
    pgVar9 = (group15<boost::unordered::detail::foa::plain_integral> *)
             (*(long *)((long)this + 0x10) + (long)arrays_ * 0x10);
    pcVar1 = (char *)(*(long *)((long)this + 0x10) + (long)arrays_ * 0x10);
    auVar10[0] = -(*pcVar1 == '\0');
    auVar10[1] = -(pcVar1[1] == '\0');
    auVar10[2] = -(pcVar1[2] == '\0');
    auVar10[3] = -(pcVar1[3] == '\0');
    auVar10[4] = -(pcVar1[4] == '\0');
    auVar10[5] = -(pcVar1[5] == '\0');
    auVar10[6] = -(pcVar1[6] == '\0');
    auVar10[7] = -(pcVar1[7] == '\0');
    auVar10[8] = -(pcVar1[8] == '\0');
    auVar10[9] = -(pcVar1[9] == '\0');
    auVar10[10] = -(pcVar1[10] == '\0');
    auVar10[0xb] = -(pcVar1[0xb] == '\0');
    auVar10[0xc] = -(pcVar1[0xc] == '\0');
    auVar10[0xd] = -(pcVar1[0xd] == '\0');
    auVar10[0xe] = -(pcVar1[0xe] == '\0');
    auVar10[0xf] = -(pcVar1[0xf] == '\0');
    uVar3 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe;
    if (uVar3 == 0) {
      pgVar9->m[0xf].n = pgVar9->m[0xf].n | '\x01' << ((byte)pos0 & 7);
    }
    else {
      uVar2 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      uVar5 = (ulong)uVar2;
      ppVar8 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ArgTokens> *)
               ((long)arrays_ * 600 + *(long *)((long)this + 0x18) + uVar5 * 0x28);
      pcVar1 = *(char **)(hash + 8);
      (ppVar8->first)._M_len = *(size_t *)hash;
      (ppVar8->first)._M_str = pcVar1;
      sVar4 = *(size_t *)(args + 8);
      (ppVar8->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_ptr =
           *(pointer *)args;
      (ppVar8->second).super_span<const_slang::parsing::Token,_18446744073709551615UL>._M_extent.
      _M_extent_value = sVar4;
      *(undefined8 *)&(ppVar8->second).isExpanded = *(undefined8 *)(args + 0x10);
      pgVar9->m[uVar5].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (pos0 & 0xff));
      pgVar7 = pgVar9;
    }
    if (uVar3 != 0) break;
    arrays_ = (arrays_type *)
              ((long)&arrays_->groups_size_index + lVar6 & *(ulong *)((long)this + 8));
    lVar6 = lVar6 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar5;
  __return_storage_ptr__->p = ppVar8;
  __return_storage_ptr__->pg = pgVar7;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }